

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

Track * __thiscall mkvmuxer::Segment::AddTrack(Segment *this,int32_t number)

{
  bool bVar1;
  Track *pTVar2;
  undefined4 in_ESI;
  Track *in_RDI;
  Track *track;
  uint *in_stack_ffffffffffffffa8;
  Track *local_40;
  uint in_stack_ffffffffffffffdc;
  uint number_00;
  undefined4 in_stack_ffffffffffffffe8;
  Track *local_8;
  
  pTVar2 = (Track *)operator_new(0x78,(nothrow_t *)&std::nothrow);
  number_00 = in_stack_ffffffffffffffdc & 0xffffff;
  local_40 = (Track *)0x0;
  if (pTVar2 != (Track *)0x0) {
    number_00 = CONCAT13(1,(int3)in_stack_ffffffffffffffdc);
    Track::Track(in_RDI,in_stack_ffffffffffffffa8);
    local_40 = pTVar2;
  }
  if (local_40 == (Track *)0x0) {
    local_8 = (Track *)0x0;
  }
  else {
    bVar1 = Tracks::AddTrack((Tracks *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),local_40,number_00
                            );
    local_8 = local_40;
    if (!bVar1) {
      if (local_40 != (Track *)0x0) {
        (*local_40->_vptr_Track[1])();
      }
      local_8 = (Track *)0x0;
    }
  }
  return local_8;
}

Assistant:

Track* Segment::AddTrack(int32_t number) {
  Track* const track = new (std::nothrow) Track(&seed_);  // NOLINT

  if (!track)
    return NULL;

  if (!tracks_.AddTrack(track, number)) {
    delete track;
    return NULL;
  }

  return track;
}